

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

int Ssw_SecGeneralMiter(Aig_Man_t *pMiter,Ssw_Pars_t *pPars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Aig_Man_t *p;
  abctime aVar5;
  abctime clk;
  int RetValue;
  Aig_Man_t *pAigRes;
  Ssw_Pars_t *pPars_local;
  Aig_Man_t *pMiter_local;
  
  aVar4 = Abc_Clock();
  p = Ssw_SignalCorrespondence(pMiter,pPars);
  iVar1 = Ssw_MiterStatus(p,1);
  if (iVar1 == 1) {
    Abc_Print(1,"Verification successful.  ");
  }
  else if (iVar1 == 0) {
    Abc_Print(1,"Verification failed with a counter-example.  ");
  }
  else {
    uVar2 = Aig_ManRegNum(p);
    uVar3 = Aig_ManRegNum(pMiter);
    Abc_Print(1,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
              (ulong)uVar2,(ulong)uVar3);
  }
  Abc_Print(1,"%s =","Time");
  aVar5 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecGeneralMiter( Aig_Man_t * pMiter, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes;
    int RetValue;
    abctime clk = Abc_Clock();
    // try the new AIGs
//    Abc_Print( 1, "Performing general verification without node pairs.\n" );
    pAigRes = Ssw_SignalCorrespondence( pMiter, pPars );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pMiter) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}